

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::FillerParameter::InternalSerializeWithCachedSizesToArray
          (FillerParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int size;
  int32 value;
  FillerParameter_VarianceNorm value_00;
  char *data;
  string *value_01;
  UnknownFieldSet *unknown_fields;
  float fVar2;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  FillerParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 1) != 0) {
    type_abi_cxx11_(this);
    data = (char *)::std::__cxx11::string::data();
    type_abi_cxx11_(this);
    size = ::std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"caffe.FillerParameter.type");
    value_01 = type_abi_cxx11_(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteStringToArray(1,value_01,target);
  }
  if ((uVar1 & 2) != 0) {
    fVar2 = FillerParameter::value(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(2,fVar2,puStack_40);
  }
  if ((uVar1 & 4) != 0) {
    fVar2 = min(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(3,fVar2,puStack_40);
  }
  if ((uVar1 & 0x40) != 0) {
    fVar2 = max(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(4,fVar2,puStack_40);
  }
  if ((uVar1 & 8) != 0) {
    fVar2 = mean(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(5,fVar2,puStack_40);
  }
  if ((uVar1 & 0x80) != 0) {
    fVar2 = std(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteFloatToArray(6,fVar2,puStack_40);
  }
  if ((uVar1 & 0x20) != 0) {
    value = sparse(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7,value,puStack_40);
  }
  if ((uVar1 & 0x10) != 0) {
    value_00 = variance_norm(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteEnumToArray(8,value_00,puStack_40)
    ;
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FillerParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* FillerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.FillerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string type = 1 [default = "constant"];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.FillerParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->type(), target);
  }

  // optional float value = 2 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(2, this->value(), target);
  }

  // optional float min = 3 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(3, this->min(), target);
  }

  // optional float max = 4 [default = 1];
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(4, this->max(), target);
  }

  // optional float mean = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(5, this->mean(), target);
  }

  // optional float std = 6 [default = 1];
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(6, this->std(), target);
  }

  // optional int32 sparse = 7 [default = -1];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(7, this->sparse(), target);
  }

  // optional .caffe.FillerParameter.VarianceNorm variance_norm = 8 [default = FAN_IN];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      8, this->variance_norm(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.FillerParameter)
  return target;
}